

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

LY_ERR subelems_allocator(lysp_yin_ctx *ctx,size_t count,lysp_node *parent,yin_subelement **result,
                         ...)

{
  int iVar1;
  char in_AL;
  yin_subelement *pyVar2;
  int *piVar3;
  undefined8 *puVar4;
  undefined2 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  uint uVar10;
  LY_ERR LVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar12;
  long lVar13;
  bool bVar14;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  int local_e8 [8];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  pyVar2 = (yin_subelement *)calloc(count,0x18);
  *result = pyVar2;
  if (pyVar2 == (yin_subelement *)0x0) {
    pyVar2 = (yin_subelement *)0x0;
LAB_0017acd3:
    subelems_deallocator(count,pyVar2);
    LVar11 = LY_EMEM;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","subelems_allocator"
          );
  }
  else {
    ap[0].overflow_arg_area = &stack0x00000008;
    uVar6 = 0x20;
    lVar13 = 0;
    sVar12 = count;
    while (bVar14 = sVar12 != 0, sVar12 = sVar12 - 1, bVar14) {
      uVar7 = (ulong)uVar6;
      if (uVar7 < 0x29) {
        uVar6 = uVar6 + 8;
        piVar3 = (int *)((long)local_e8 + uVar7);
      }
      else {
        piVar3 = (int *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      iVar1 = *piVar3;
      pyVar2 = *result;
      *(int *)((long)&pyVar2->type + lVar13) = iVar1;
      uVar10 = uVar6;
      switch(iVar1) {
      case 1:
      case 2:
      case 4:
      case 8:
switchD_0017abbc_caseD_1:
        puVar4 = (undefined8 *)calloc(1,0x10);
        if (puVar4 == (undefined8 *)0x0) goto LAB_0017acd3;
        *puVar4 = parent;
        uVar8 = (ulong)uVar6;
        if (uVar8 < 0x29) {
          uVar10 = uVar6 + 8;
          goto LAB_0017abfd;
        }
LAB_0017ac58:
        puVar9 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
        break;
      case 3:
      case 5:
      case 6:
      case 7:
switchD_0017abbc_caseD_3:
        uVar7 = (ulong)uVar6;
        if (uVar7 < 0x29) {
          uVar6 = uVar6 + 8;
          puVar4 = (undefined8 *)((long)local_e8 + uVar7);
        }
        else {
          puVar4 = (undefined8 *)ap[0].overflow_arg_area;
          ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
        }
        puVar4 = (undefined8 *)*puVar4;
        uVar10 = uVar6;
        goto LAB_0017ac6d;
      default:
        if (((((((iVar1 - 0x10U < 0x31) &&
                ((0x1000000010001U >> ((ulong)(iVar1 - 0x10U) & 0x3f) & 1) != 0)) || (iVar1 == 0x80)
               ) || ((iVar1 == 0x100 || (iVar1 == 0x200)))) ||
             ((iVar1 == 0x400 || ((iVar1 == 0x800 || (iVar1 == 0x1000)))))) || (iVar1 == 0x2000)) ||
           ((iVar1 == 0x4000 || (iVar1 == 0x2f0000)))) goto switchD_0017abbc_caseD_1;
        if ((iVar1 != 0x140000) && (iVar1 != 0x150000)) {
          if (iVar1 != 0x8000) goto switchD_0017abbc_caseD_3;
          goto switchD_0017abbc_caseD_1;
        }
        puVar4 = (undefined8 *)calloc(1,0x10);
        if (puVar4 == (undefined8 *)0x0) goto LAB_0017acd3;
        uVar7 = (ulong)uVar6;
        if (0x28 < uVar7) {
          *puVar4 = *ap[0].overflow_arg_area;
          ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
          goto LAB_0017ac58;
        }
        uVar8 = uVar7 + 8;
        *puVar4 = *(undefined8 *)((long)local_e8 + uVar7);
        uVar10 = (uint)uVar8;
        if (0x20 < uVar6) goto LAB_0017ac58;
        uVar10 = uVar6 + 0x10;
LAB_0017abfd:
        puVar9 = (undefined8 *)((long)local_e8 + uVar8);
      }
      puVar4[1] = *puVar9;
LAB_0017ac6d:
      *(undefined8 **)((long)&pyVar2->dest + lVar13) = puVar4;
      if ((ulong)uVar10 < 0x29) {
        puVar5 = (undefined2 *)((long)local_e8 + (ulong)uVar10);
        uVar6 = uVar10 + 8;
      }
      else {
        puVar5 = (undefined2 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
        uVar6 = uVar10;
      }
      *(undefined2 *)((long)&(*result)->flags + lVar13) = *puVar5;
      lVar13 = lVar13 + 0x18;
    }
    LVar11 = LY_SUCCESS;
  }
  return LVar11;
}

Assistant:

static LY_ERR
subelems_allocator(struct lysp_yin_ctx *ctx, size_t count, struct lysp_node *parent,
        struct yin_subelement **result, ...)
{
    va_list ap;

    *result = calloc(count, sizeof **result);
    LY_CHECK_GOTO(!(*result), mem_err);

    va_start(ap, result);
    for (size_t i = 0; i < count; ++i) {
        /* TYPE */
        (*result)[i].type = va_arg(ap, enum ly_stmt);
        /* DEST */
        if (IS_NODE_ELEM((*result)[i].type)) {
            struct tree_node_meta *node_meta = NULL;

            node_meta = calloc(1, sizeof *node_meta);
            LY_CHECK_GOTO(!node_meta, mem_err);
            node_meta->parent = parent;
            node_meta->nodes = va_arg(ap, void *);
            (*result)[i].dest = node_meta;
        } else if ((*result)[i].type == LY_STMT_IMPORT) {
            struct import_meta *imp_meta = NULL;

            imp_meta = calloc(1, sizeof *imp_meta);
            LY_CHECK_GOTO(!imp_meta, mem_err);
            imp_meta->prefix = va_arg(ap, const char *);
            imp_meta->imports = va_arg(ap, struct lysp_import **);
            (*result)[i].dest = imp_meta;
        } else if ((*result)[i].type == LY_STMT_INCLUDE) {
            struct include_meta *inc_meta = NULL;

            inc_meta = calloc(1, sizeof *inc_meta);
            LY_CHECK_GOTO(!inc_meta, mem_err);
            inc_meta->name = va_arg(ap, const char *);
            inc_meta->includes = va_arg(ap, struct lysp_include **);
            (*result)[i].dest = inc_meta;
        } else if (((*result)[i].type == LY_STMT_INPUT) || ((*result)[i].type == LY_STMT_OUTPUT)) {
            struct inout_meta *inout_meta = NULL;

            inout_meta = calloc(1, sizeof *inout_meta);
            LY_CHECK_GOTO(!inout_meta, mem_err);
            inout_meta->parent = parent;
            inout_meta->inout_p = va_arg(ap, struct lysp_node_action_inout *);
            (*result)[i].dest = inout_meta;
        } else {
            (*result)[i].dest = va_arg(ap, void *);
        }
        /* FLAGS */
        (*result)[i].flags = va_arg(ap, int);
    }
    va_end(ap);

    return LY_SUCCESS;

mem_err:
    subelems_deallocator(count, *result);
    LOGMEM(ctx->xmlctx->ctx);
    return LY_EMEM;
}